

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCADeserialization.cpp
# Opt level: O0

Var Js::SCADeserializationEngine::Deserialize
              (StreamReader *reader,Var *transferableVars,size_t cTransferableVars)

{
  scaposition_t root;
  void *pvVar1;
  Var value;
  undefined1 local_50 [4];
  uint32 version;
  StreamDeserializationCloner cloner;
  ScriptContext *scriptContext;
  size_t cTransferableVars_local;
  Var *transferableVars_local;
  StreamReader *reader_local;
  
  cloner._32_8_ = ScriptContextHolder::GetScriptContext(&reader->super_ScriptContextHolder);
  DeserializationCloner<Js::StreamReader>::DeserializationCloner
            ((DeserializationCloner<Js::StreamReader> *)local_50,(ScriptContext *)cloner._32_8_,
             reader);
  StreamReader::Read<unsigned_int>(reader,(uint *)((long)&value + 4));
  if (1 < value._4_4_ >> 0x18) {
    ScriptContextHolder::ThrowSCANewVersion((ScriptContextHolder *)local_50);
  }
  root = StreamReader::GetPosition(reader);
  pvVar1 = SCAEngine<unsigned_int,_void_*,_Js::DeserializationCloner<Js::StreamReader>_>::Clone
                     (root,(DeserializationCloner<Js::StreamReader> *)local_50,transferableVars,
                      cTransferableVars);
  if (pvVar1 == (void *)0x0) {
    ScriptContextHolder::ThrowSCADataCorrupt((ScriptContextHolder *)local_50);
  }
  return pvVar1;
}

Assistant:

Var SCADeserializationEngine::Deserialize(StreamReader* reader, Var* transferableVars, size_t cTransferableVars)
    {
        ScriptContext* scriptContext = reader->GetScriptContext();
        StreamDeserializationCloner cloner(scriptContext, reader);

        // Read version
        uint32 version;
        reader->Read(&version);
        if (GetSCAMajor(version) > SCA_FORMAT_MAJOR)
        {
            cloner.ThrowSCANewVersion();
        }
        Var value = SCAEngine<scaposition_t, Var, StreamDeserializationCloner>::Clone(reader->GetPosition(), &cloner, transferableVars, cTransferableVars);
        if (!value)
        {
            cloner.ThrowSCADataCorrupt();
        }

        return value;
    }